

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

bool __thiscall QGroupBoxPrivate::shouldHandleKeyEvent(QGroupBoxPrivate *this,QKeyEvent *keyEvent)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QList<Qt::Key> local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  if ((((*(byte *)(*(long *)(lVar3 + 0x20) + 8) & 1) == 0) &&
      (*(char *)(*(long *)(lVar3 + 8) + 0x279) == '\x01')) && (-1 < *(short *)(keyEvent + 0x50))) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d._0_4_ = 0xaaaaaaaa;
    local_58.d.d._4_4_ = 0xaaaaaaaa;
    local_58.d.ptr._0_4_ = 0xaaaaaaaa;
    local_58.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_40,QGuiApplicationPrivate::platform_theme,0x28);
    qvariant_cast<QList<Qt::Key>>(&local_58,&local_40);
    ::QVariant::~QVariant(&local_40);
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_0040b18a:
      bVar4 = false;
    }
    else {
      lVar3 = 0;
      do {
        if (local_58.d.size << 2 == lVar3) goto LAB_0040b18a;
        lVar1 = lVar3 + 4;
        piVar2 = (int *)(CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_) + lVar3);
        lVar3 = lVar1;
      } while (*piVar2 != *(int *)(keyEvent + 0x40));
      bVar4 = lVar1 != 0;
    }
    piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),4,0x10)
        ;
      }
    }
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGroupBoxPrivate::shouldHandleKeyEvent(const QKeyEvent *keyEvent) const
{
    Q_Q(const QGroupBox);

    if (!q->isEnabled() || !q->isCheckable() || keyEvent->isAutoRepeat())
        return false;

    const QList<Qt::Key> buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                           ->themeHint(QPlatformTheme::ButtonPressKeys)
                                           .value<QList<Qt::Key>>();
    return buttonPressKeys.contains(keyEvent->key());
}